

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O1

int __thiscall CaDiCaL::Internal::trivially_true_satisfiable(Internal *this)

{
  anon_struct_8_2_4505284c_for_terminate *paVar1;
  anon_struct_16_2_20cb3f79_for_constant_forward_backward *paVar2;
  int iVar3;
  int iVar4;
  pointer ppCVar5;
  Terminator *pTVar6;
  Clause *pCVar7;
  char cVar8;
  bool bVar9;
  Clause *__range2;
  bool bVar10;
  int in_ESI;
  long lVar11;
  bool bVar12;
  int lit;
  pointer ppCVar13;
  bool bVar14;
  bool bVar15;
  
  ppCVar13 = (this->clauses).
             super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar5 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar14 = ppCVar13 == ppCVar5;
  if (!bVar14) {
    do {
      if (this->termination_forced == false) {
        iVar3 = (this->lim).terminate.forced;
        if ((iVar3 != 0) && ((this->lim).terminate.forced = iVar3 + -1, iVar3 == 1)) {
LAB_0083ceaa:
          this->termination_forced = true;
          goto LAB_0083ceb1;
        }
        pTVar6 = this->external->terminator;
        if (pTVar6 != (Terminator *)0x0) {
          paVar1 = &(this->lim).terminate;
          iVar3 = paVar1->check;
          paVar1->check = paVar1->check + -1;
          if (iVar3 == 0) {
            (this->lim).terminate.check = (this->opts).terminateint * 100;
            cVar8 = (**(code **)(*(long *)pTVar6 + 0x10))();
            if (cVar8 != '\0') goto LAB_0083ceaa;
          }
        }
        pCVar7 = *ppCVar13;
        bVar10 = true;
        if ((*(ushort *)&pCVar7->field_0x8 & 0x810) == 0) {
          if ((long)pCVar7->size != 0) {
            bVar12 = false;
            bVar10 = false;
            bVar9 = false;
            lVar11 = 0;
            do {
              iVar3 = *(int *)((long)&pCVar7[1].field_0 + lVar11);
              bVar15 = true;
              if (this->vals[iVar3] < '\x01') {
                if (this->vals[iVar3] < '\0') {
                  bVar15 = false;
                }
                else {
                  bVar15 = -1 < iVar3;
                  bVar9 = bVar10;
                  if (bVar15) {
                    bVar9 = true;
                    bVar10 = bVar9;
                  }
                }
              }
              else {
                bVar12 = true;
              }
            } while ((!bVar15) &&
                    (bVar15 = (long)pCVar7->size * 4 + -4 != lVar11, lVar11 = lVar11 + 4, bVar15));
            bVar10 = true;
            if ((bVar12) || (bVar9)) goto LAB_0083ceda;
          }
          if (0 < this->level) {
            backtrack(this,0);
          }
          in_ESI = 0;
          goto LAB_0083cec9;
        }
      }
      else {
LAB_0083ceb1:
        if (0 < this->level) {
          backtrack(this,0);
        }
        in_ESI = -1;
LAB_0083cec9:
        if (this->conflict != (Clause *)0x0) {
          this->conflict = (Clause *)0x0;
        }
        bVar10 = false;
      }
LAB_0083ceda:
      if (!bVar10) break;
      ppCVar13 = ppCVar13 + 1;
      bVar14 = ppCVar13 == ppCVar5;
    } while (!bVar14);
  }
  if (bVar14) {
    if (this->internal != (Internal *)0x0) {
      verbose(this->internal,1,"all clauses contain a positive literal");
    }
    iVar3 = *(this->vars).n;
    bVar14 = iVar3 == 0;
    if (!bVar14) {
      lit = 1;
      do {
        if (this->termination_forced == false) {
          iVar4 = (this->lim).terminate.forced;
          if ((iVar4 != 0) && ((this->lim).terminate.forced = iVar4 + -1, iVar4 == 1)) {
LAB_0083d056:
            this->termination_forced = true;
            goto LAB_0083d05d;
          }
          pTVar6 = this->external->terminator;
          if (pTVar6 != (Terminator *)0x0) {
            paVar1 = &(this->lim).terminate;
            iVar4 = paVar1->check;
            paVar1->check = paVar1->check + -1;
            if (iVar4 == 0) {
              (this->lim).terminate.check = (this->opts).terminateint * 10;
              cVar8 = (**(code **)(*(long *)pTVar6 + 0x10))();
              if (cVar8 != '\0') goto LAB_0083d056;
            }
          }
          bVar10 = true;
          if (this->vals[lit] == '\0') {
            search_assume_decision(this,lit);
            bVar9 = propagate(this);
            if (bVar9) goto LAB_0083d086;
            if (0 < this->level) {
              backtrack(this,0);
            }
            in_ESI = 0;
            goto LAB_0083d075;
          }
        }
        else {
LAB_0083d05d:
          if (0 < this->level) {
            backtrack(this,0);
          }
          in_ESI = -1;
LAB_0083d075:
          if (this->conflict != (Clause *)0x0) {
            this->conflict = (Clause *)0x0;
          }
          bVar10 = false;
        }
LAB_0083d086:
        if (!bVar10) break;
        bVar14 = lit == iVar3;
        lit = lit + 1;
      } while (!bVar14);
    }
    if (bVar14) {
      paVar2 = &(this->stats).lucky.constant;
      paVar2->one = paVar2->one + 1;
      in_ESI = 10;
    }
  }
  return in_ESI;
}

Assistant:

int Internal::trivially_true_satisfiable () {
  LOG ("checking that all clauses contain a positive literal");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (100))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    bool satisfied = false, found_positive_literal = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit < 0)
        continue;
      found_positive_literal = true;
      break;
    }
    if (satisfied || found_positive_literal)
      continue;
    LOG (c, "found purely negatively");
    return unlucky (0);
  }
  VERBOSE (1, "all clauses contain a positive literal");
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    assert (level > 0);
    LOG ("propagation failed including redundant clauses");
    return unlucky (0);
  }
  stats.lucky.constant.one++;
  return 10;
}